

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O0

void pzshape::TPZShapeLinear::ShapeInternal
               (FADREAL *x,int num,TPZVec<Fad<double>_> *phi,int transformation_index)

{
  undefined8 in_RDX;
  int in_ESI;
  FADREAL y;
  Fad<double> *in_stack_ffffffffffffffb0;
  FADREAL *in_stack_ffffffffffffffc0;
  FADREAL *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  
  if (0 < in_ESI) {
    Fad<double>::Fad(in_stack_ffffffffffffffc0);
    TransformPoint1d(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    (*(code *)FADfOrthogonal)(&stack0xffffffffffffffc0,in_ESI,in_RDX);
    Fad<double>::~Fad(in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void TPZShapeLinear::ShapeInternal(FADREAL & x,int num,TPZVec<FADREAL> & phi,int transformation_index){
		// Quadratic or higher shape functions
		if(num <= 0) return;
		FADREAL y;
		TransformPoint1d(transformation_index,x,y);
		FADfOrthogonal(y,num,phi);
		//  TransformDerivative1d(transformation_index,num,phi);
	}